

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O3

void zmMulBarr(word *c,word *a,word *b,qr_o *r,void *stack)

{
  size_t n;
  void *stack_00;
  
  n = r->n;
  stack_00 = (void *)(n * 0x10 + (long)stack);
  zzMul((word *)stack,a,n,b,n,stack_00);
  zzRedBarr((word *)stack,r->mod,r->n,(word *)r->params,stack_00);
  wwCopy(c,(word *)stack,r->n);
  return;
}

Assistant:

static void zmMulBarr(word c[], const word a[], const word b[],
	const qr_o* r, void* stack)
{
	word* prod = (word*)stack;
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(a, r));
	ASSERT(zmIsIn(b, r));
	stack = prod + 2 * r->n;
	zzMul(prod, a, r->n, b, r->n, stack);
	zzRedBarr(prod, r->mod, r->n, r->params, stack);
	wwCopy(c, prod, r->n);
}